

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gif.h
# Opt level: O0

void GifPartitionByMedian(uint8_t *image,int left,int right,int com,int neededCenter)

{
  int com_00;
  int in_ECX;
  int in_EDX;
  int in_ESI;
  undefined8 in_RDI;
  int in_R8D;
  uint8_t *unaff_retaddr;
  int pivotIndex;
  int iVar1;
  
  if (in_ESI < in_EDX + -1) {
    iVar1 = in_ESI;
    com_00 = GifPartition(unaff_retaddr,(int)((ulong)in_RDI >> 0x20),(int)in_RDI,in_ESI,in_EDX);
    if (in_R8D < com_00) {
      GifPartitionByMedian((uint8_t *)CONCAT44(iVar1,in_EDX),in_ECX,in_R8D,com_00,in_ESI);
    }
    if (com_00 < in_R8D) {
      GifPartitionByMedian((uint8_t *)CONCAT44(iVar1,in_EDX),in_ECX,in_R8D,com_00,in_ESI);
    }
  }
  return;
}

Assistant:

void GifPartitionByMedian(uint8_t* image, int left, int right, int com, int neededCenter)
{
    if(left < right-1)
    {
        int pivotIndex = left + (right-left)/2;

        pivotIndex = GifPartition(image, left, right, com, pivotIndex);

        // Only "sort" the section of the array that contains the median
        if(pivotIndex > neededCenter)
            GifPartitionByMedian(image, left, pivotIndex, com, neededCenter);

        if(pivotIndex < neededCenter)
            GifPartitionByMedian(image, pivotIndex+1, right, com, neededCenter);
    }
}